

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_packusdw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint32_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  
  uVar2 = d->_l_ZMMReg[0];
  if (0xfffe < (int)d->_l_ZMMReg[0]) {
    uVar2 = 0xffff;
  }
  uVar5 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar7 = d->_l_ZMMReg[1];
  if (0xfffe < (int)uVar7) {
    uVar7 = 0xffff;
  }
  uVar6 = (uint16_t)uVar7;
  if ((int)uVar7 < 1) {
    uVar6 = uVar5;
  }
  uVar7 = d->_l_ZMMReg[2];
  if (0xfffe < (int)uVar7) {
    uVar7 = 0xffff;
  }
  uVar8 = (uint16_t)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar5;
  }
  uVar7 = d->_l_ZMMReg[3];
  if (0xfffe < (int)uVar7) {
    uVar7 = 0xffff;
  }
  uVar9 = (uint16_t)uVar7;
  if ((int)uVar7 < 1) {
    uVar9 = uVar5;
  }
  uVar7 = s->_l_ZMMReg[0];
  if (0xfffe < (int)uVar7) {
    uVar7 = 0xffff;
  }
  uVar10 = (uint16_t)uVar7;
  if ((int)uVar7 < 1) {
    uVar10 = uVar5;
  }
  uVar7 = s->_l_ZMMReg[1];
  if (0xfffe < (int)uVar7) {
    uVar7 = 0xffff;
  }
  uVar3 = (uint16_t)uVar7;
  if ((int)uVar7 < 1) {
    uVar3 = uVar5;
  }
  uVar7 = s->_l_ZMMReg[2];
  if (0xfffe < (int)uVar7) {
    uVar7 = 0xffff;
  }
  uVar4 = (uint16_t)uVar7;
  if ((int)uVar7 < 1) {
    uVar4 = uVar5;
  }
  uVar7 = 0xffff;
  if ((int)s->_l_ZMMReg[3] < 0xffff) {
    uVar7 = s->_l_ZMMReg[3];
  }
  uVar1 = (uint16_t)uVar7;
  if ((int)uVar7 < 1) {
    uVar1 = uVar5;
  }
  d->_w_ZMMReg[0] = (uint16_t)uVar2;
  d->_w_ZMMReg[1] = uVar6;
  d->_w_ZMMReg[2] = uVar8;
  d->_w_ZMMReg[3] = uVar9;
  d->_w_ZMMReg[4] = uVar10;
  d->_w_ZMMReg[5] = uVar3;
  d->_w_ZMMReg[6] = uVar4;
  d->_w_ZMMReg[7] = uVar1;
  return;
}

Assistant:

void glue(helper_packusdw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    Reg r;

    r.W(0) = satuw((int32_t) d->L(0));
    r.W(1) = satuw((int32_t) d->L(1));
    r.W(2) = satuw((int32_t) d->L(2));
    r.W(3) = satuw((int32_t) d->L(3));
    r.W(4) = satuw((int32_t) s->L(0));
    r.W(5) = satuw((int32_t) s->L(1));
    r.W(6) = satuw((int32_t) s->L(2));
    r.W(7) = satuw((int32_t) s->L(3));
    *d = r;
}